

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void stable_grail_common_sort(int **arr,int Len,int **extbuf,int LExtBuf)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int len;
  int iVar5;
  int in_ECX;
  int iVar6;
  size_t in_RDX;
  int in_ESI;
  longlong s;
  int chavebuf;
  int havebuf;
  int nk;
  int lb;
  int cbuf;
  int ptr;
  int findkeys;
  int nkeys;
  int lblock;
  size_t in_stack_ffffffffffffff78;
  int **in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  int **in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  long local_48;
  int in_stack_ffffffffffffffc8;
  int iVar7;
  int iVar8;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (in_ESI < 0x11) {
    stable_bitonic_sort(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    for (iVar7 = 1; iVar7 * iVar7 < in_ESI; iVar7 = iVar7 << 1) {
    }
    iVar3 = (in_ESI + -1) / iVar7 + 1;
    iVar4 = stable_grail_find_keys
                      (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                       (int)in_stack_ffffffffffffff88);
    bVar1 = true;
    iVar8 = iVar7;
    if (iVar4 < iVar3 + iVar7) {
      if (iVar4 < 4) {
        stable_grail_lazy_stable_sort
                  (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
        return;
      }
      for (; iVar4 < iVar7; iVar7 = iVar7 / 2) {
      }
      bVar1 = false;
      iVar8 = 0;
      iVar3 = iVar7;
    }
    len = iVar8 + iVar3;
    iVar7 = iVar3;
    if (bVar1) {
      iVar6 = iVar8;
      stable_grail_build_blocks
                ((int **)CONCAT44(iVar8,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac,
                 in_stack_ffffffffffffffa8,
                 (int **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),iVar5);
      iVar3 = iVar8;
      iVar8 = iVar6;
    }
    else {
      stable_grail_build_blocks
                ((int **)CONCAT44(iVar3,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac,
                 in_stack_ffffffffffffffa8,
                 (int **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),iVar5);
    }
    while( true ) {
      iVar5 = in_ESI - len;
      iVar6 = iVar3 * 2;
      if (iVar5 == iVar6 || SBORROW4(iVar5,iVar6) != iVar5 + iVar3 * -2 < 0) break;
      iVar5 = iVar8;
      bVar2 = bVar1;
      if (!bVar1) {
        if ((iVar7 < 5) || ((iVar7 / 8) * iVar7 < iVar6)) {
          local_48 = ((long)iVar6 * (long)iVar4) / 2;
          for (in_stack_ffffffffffffffc8 = 1; in_stack_ffffffffffffffc8 < iVar7 && local_48 != 0;
              in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 << 1) {
            local_48 = local_48 / 8;
          }
          iVar5 = (iVar3 << 2) / in_stack_ffffffffffffffc8;
        }
        else {
          iVar5 = iVar7 / 2;
          bVar2 = true;
        }
      }
      if ((!bVar2) || (in_stack_ffffffffffffff78 = in_RDX, in_ECX < iVar5)) {
        in_stack_ffffffffffffff78 = 0;
      }
      stable_grail_combine_blocks
                ((int **)CONCAT44(in_ECX,iVar8),(int **)CONCAT44(iVar7,iVar4),len,iVar6,iVar5,
                 in_stack_ffffffffffffffc8,(int **)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
      iVar3 = iVar6;
    }
    stable_bitonic_sort(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    stable_grail_merge_without_buffer
              (in_stack_ffffffffffffff80,(int)(in_stack_ffffffffffffff78 >> 0x20),
               (int)in_stack_ffffffffffffff78);
  }
  return;
}

Assistant:

static void GRAIL_COMMON_SORT(SORT_TYPE *arr, int Len, SORT_TYPE *extbuf,
                              int LExtBuf) {
  int lblock, nkeys, findkeys, ptr, cbuf, lb, nk;
  int havebuf, chavebuf;
  long long s;

  if (Len <= SMALL_SORT_BND) {
    SMALL_SORT(arr, Len);
    return;
  }

  lblock = 1;

  while (lblock * lblock < Len) {
    lblock *= 2;
  }

  nkeys = (Len - 1) / lblock + 1;
  findkeys = GRAIL_FIND_KEYS(arr, Len, nkeys + lblock);
  havebuf = 1;

  if (findkeys < nkeys + lblock) {
    if (findkeys < 4) {
      GRAIL_LAZY_STABLE_SORT(arr, Len);
      return;
    }

    nkeys = lblock;

    while (nkeys > findkeys) {
      nkeys /= 2;
    }

    havebuf = 0;
    lblock = 0;
  }

  ptr = lblock + nkeys;
  cbuf = havebuf ? lblock : nkeys;

  if (havebuf) {
    GRAIL_BUILD_BLOCKS(arr + ptr, Len - ptr, cbuf, extbuf, LExtBuf);
  } else {
    GRAIL_BUILD_BLOCKS(arr + ptr, Len - ptr, cbuf, NULL, 0);
  }

  /* 2*cbuf are built */
  while (Len - ptr > (cbuf *= 2)) {
    lb = lblock;
    chavebuf = havebuf;

    if (!havebuf) {
      if (nkeys > 4 && nkeys / 8 * nkeys >= cbuf) {
        lb = nkeys / 2;
        chavebuf = 1;
      } else {
        nk = 1;
        s = (long long)cbuf * findkeys / 2;

        while (nk < nkeys && s != 0) {
          nk *= 2;
          s /= 8;
        }

        lb = (2 * cbuf) / nk;
      }
    }

    GRAIL_COMBINE_BLOCKS(arr, arr + ptr, Len - ptr, cbuf, lb, chavebuf,
                         chavebuf && lb <= LExtBuf ? extbuf : NULL);
  }

  SMALL_SORT(arr, ptr);
  GRAIL_MERGE_WITHOUT_BUFFER(arr, ptr, Len - ptr);
}